

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

void connection_cb(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_tcp_t *puVar2;
  uv_write_t *puVar3;
  uv_buf_t buf;
  
  if (server == (uv_stream_t *)&tcp_server) {
    puVar3 = (uv_write_t *)server;
    if (status != 0) goto LAB_00174df1;
    status = 0x505e68;
    puVar3 = (uv_write_t *)tcp_server.loop;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00174df6;
    puVar2 = &tcp_server;
    status = 0x505e68;
    iVar1 = uv_accept();
    puVar3 = (uv_write_t *)puVar2;
    if (iVar1 != 0) goto LAB_00174dfb;
    puVar2 = &tcp_peer;
    status = 0x174e34;
    iVar1 = uv_read_start(&tcp_peer,alloc_cb,read_cb);
    puVar3 = (uv_write_t *)puVar2;
    if (iVar1 == 0) {
      puVar3 = &write_req;
      status = 0x505e68;
      iVar1 = uv_write();
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00174e05;
    }
  }
  else {
    connection_cb_cold_1();
    puVar3 = (uv_write_t *)server;
LAB_00174df1:
    connection_cb_cold_2();
LAB_00174df6:
    connection_cb_cold_3();
LAB_00174dfb:
    connection_cb_cold_4();
  }
  connection_cb_cold_5();
LAB_00174e05:
  connection_cb_cold_6();
  if (puVar3 == (uv_write_t *)&connect_req) {
    if (status == 0) {
      uv_close(&tcp_client,0);
      return;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void connection_cb(uv_stream_t* server, int status) {
  ASSERT(status == 0);

  ASSERT(0 == uv_tcp_init(loop, &tcp_accepted));
  ASSERT(0 == uv_accept(server, (uv_stream_t*) &tcp_accepted));

  uv_read_start((uv_stream_t*) &tcp_accepted, alloc_cb, read_cb);
}